

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void display_rip(int how,char *kilbuf,char *pbuf,long umoney)

{
  short sVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  monst *pmVar5;
  _func_void_nh_menuitem_ptr_int_nh_bool_char_ptr_int_char_ptr_int_int *p_Var6;
  undefined8 uVar7;
  boolean bVar8;
  char cVar9;
  int iVar10;
  char *pcVar11;
  nh_menuitem *pnVar12;
  char *pcVar13;
  obj *poVar14;
  bool local_255;
  uint local_254;
  char *local_248;
  char *local_210;
  char *local_1f8;
  char *local_1f0;
  nh_menuitem *_item__8;
  nh_menuitem *_item__7;
  nh_menuitem *_item__6;
  nh_menuitem *_item__5;
  char *where;
  nh_menuitem *_item__4;
  long count;
  int typ;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  val_list *pvStack_170;
  int i;
  val_list *val;
  obj *otmp;
  monst *mtmp;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  undefined1 auStack_140 [4];
  int saved_stopprint;
  menulist menu;
  char local_128 [7];
  boolean show_endwin;
  char outrip_buf [256];
  long umoney_local;
  char *pbuf_local;
  char *kilbuf_local;
  int how_local;
  
  iVar4 = program_state.stopprint;
  menu.icount._3_1_ = '\0';
  program_state.stopprint = 0;
  outrip_buf._248_8_ = umoney;
  init_menulist((menulist *)auStack_140);
  if (program_state.game_running == 0) {
    program_state.stopprint = 1;
  }
  else {
    (*windowprocs.win_pause)(P_MESSAGE);
    if ((program_state.stopprint == 0) || (flags.tombstone != '\0')) {
      menu.icount._3_1_ = '\x01';
    }
    if ((((how < 0xb) || (how == 0xb)) && (flags.tombstone != '\0')) && (menu.icount._3_1_ != '\0'))
    {
      if (killer_format != 0) {
        if (killer_format == 1) {
          strcpy(local_128,killed_by_prefix[how]);
          strcat(local_128,killer);
          goto LAB_001cfa23;
        }
        if (killer_format == 2) {
          strcpy(local_128,killer);
          goto LAB_001cfa23;
        }
        warning("bad killer format?");
      }
      strcpy(local_128,killed_by_prefix[how]);
      pcVar11 = an(killer);
      strcat(local_128,pcVar11);
    }
  }
LAB_001cfa23:
  if ((u.uhave._0_1_ & 1) == 0) {
    if (how == 0xf) {
      bVar8 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      if (bVar8 == '\0') {
        poVar14 = carrying(0xd8);
        if (poVar14 != (obj *)0x0) {
          strcat(kilbuf," (with a fake Amulet)");
        }
      }
      else {
        strcat(kilbuf," (in celestial disgrace)");
      }
    }
  }
  else {
    strcat(kilbuf," (with the Amulet)");
  }
  if (program_state.stopprint == 0) {
    pcVar11 = Goodbye();
    if (how == 0x11) {
      local_1f8 = "Demigod";
      if (flags.female != '\0') {
        local_1f8 = "Demigoddess";
      }
    }
    else {
      if ((flags.female == '\0') || (urole.name.f == (char *)0x0)) {
        local_1f0 = urole.name.m;
      }
      else {
        local_1f0 = urole.name.f;
      }
      local_1f8 = local_1f0;
    }
    sprintf(pbuf,"%s %s the %s...",pcVar11,plname,local_1f8);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
    }
    pnVar12 = _auStack_140 + menu.items._4_4_;
    pnVar12->id = 0;
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,pbuf);
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
    }
    pnVar12 = _auStack_140 + menu.items._4_4_;
    pnVar12->id = 0;
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,"");
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  if (((how == 0xf) || (how == 0x10)) || (how == 0x11)) {
    for (pvStack_170 = valuables; pvStack_170->list != (valuable_data *)0x0;
        pvStack_170 = pvStack_170 + 1) {
      for (_item__2._4_4_ = 0; _item__2._4_4_ < pvStack_170->size;
          _item__2._4_4_ = _item__2._4_4_ + 1) {
        pvStack_170->list[_item__2._4_4_].count = 0;
      }
    }
    get_valuables(invent);
    for (pvStack_170 = valuables; pvStack_170->list != (valuable_data *)0x0;
        pvStack_170 = pvStack_170 + 1) {
      for (_item__2._4_4_ = 0; _item__2._4_4_ < pvStack_170->size;
          _item__2._4_4_ = _item__2._4_4_ + 1) {
        if (pvStack_170->list[_item__2._4_4_].count != 0) {
          u.urscore = u.urscore +
                      (int)pvStack_170->list[_item__2._4_4_].count *
                      (int)objects[pvStack_170->list[_item__2._4_4_].typ].oc_cost;
        }
      }
    }
    artifact_score(invent,'\x01',(menulist *)auStack_140);
    keepdogs(1,(char *)0x0);
    **viz_array = **viz_array | 2;
    pmVar5 = mydogs;
    otmp = (obj *)mydogs;
    if (program_state.stopprint == 0) {
      strcpy(pbuf,"You");
    }
    if (pmVar5 == (monst *)0x0) {
      if (program_state.stopprint == 0) {
        strcat(pbuf," ");
      }
    }
    else {
      for (; otmp != (obj *)0x0; otmp = otmp->nobj) {
        if (program_state.stopprint == 0) {
          pcVar11 = eos(pbuf);
          pcVar13 = mon_nam((monst *)otmp);
          sprintf(pcVar11," and %s",pcVar13);
        }
        if (otmp->onamelth != '\0') {
          u.urscore = otmp->owt + u.urscore;
        }
      }
      if (program_state.stopprint == 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
        }
        pnVar12 = _auStack_140 + menu.items._4_4_;
        pnVar12->id = 0;
        pnVar12->role = MI_TEXT;
        pnVar12->accel = '\0';
        pnVar12->group_accel = '\0';
        pnVar12->selected = '\0';
        strcpy(pnVar12->caption,pbuf);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
      *pbuf = '\0';
    }
    if (program_state.stopprint == 0) {
      pcVar11 = eos(pbuf);
      if (how == 0x11) {
        local_210 = "went to your reward";
      }
      else {
        local_210 = "escaped from the dungeon";
        if (how == 0x10) {
          local_210 = "defied the gods and escaped";
        }
      }
      pcVar13 = "s";
      if (u.urscore == 1) {
        pcVar13 = "";
      }
      sprintf(pcVar11,"%s with %d point%s,",local_210,(ulong)(uint)u.urscore,pcVar13);
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
      }
      pnVar12 = _auStack_140 + menu.items._4_4_;
      pnVar12->id = 0;
      pnVar12->role = MI_TEXT;
      pnVar12->accel = '\0';
      pnVar12->group_accel = '\0';
      pnVar12->selected = '\0';
      strcpy(pnVar12->caption,pbuf);
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if (program_state.stopprint == 0) {
      artifact_score(invent,'\0',(menulist *)auStack_140);
    }
    for (pvStack_170 = valuables; pvStack_170->list != (valuable_data *)0x0;
        pvStack_170 = pvStack_170 + 1) {
      sort_valuables(pvStack_170->list,pvStack_170->size);
      for (_item__2._4_4_ = 0; _item__2._4_4_ < pvStack_170->size && program_state.stopprint == 0;
          _item__2._4_4_ = _item__2._4_4_ + 1) {
        iVar2 = pvStack_170->list[_item__2._4_4_].typ;
        lVar3 = pvStack_170->list[_item__2._4_4_].count;
        if (lVar3 != 0) {
          if ((objects[iVar2].oc_class == '\r') && (0x205 < iVar2)) {
            pcVar11 = "s";
            if (lVar3 == 1) {
              pcVar11 = "";
            }
            sprintf(pbuf,"%8ld worthless piece%s of colored glass,",lVar3,pcVar11);
          }
          else {
            poVar14 = mksobj(level,iVar2,'\0','\0');
            discover_object((int)poVar14->otyp,'\x01','\x01');
            *(uint *)&poVar14->field_0x4a = *(uint *)&poVar14->field_0x4a & 0xffffffef | 0x10;
            *(uint *)&poVar14->field_0x4a = *(uint *)&poVar14->field_0x4a & 0xffffffdf | 0x20;
            poVar14->onamelth = '\0';
            poVar14->quan = (int)lVar3;
            pcVar11 = xname(poVar14);
            sVar1 = objects[iVar2].oc_cost;
            pcVar13 = currency(2);
            sprintf(pbuf,"%8ld %s (worth %ld %s),",lVar3,pcVar11,lVar3 * sVar1,pcVar13);
            obfree(poVar14,(obj *)0x0);
          }
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
          }
          pnVar12 = _auStack_140 + menu.items._4_4_;
          pnVar12->id = 0;
          pnVar12->role = MI_TEXT;
          pnVar12->accel = '\0';
          pnVar12->group_accel = '\0';
          pnVar12->selected = '\0';
          strcpy(pnVar12->caption,pbuf);
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
      }
    }
  }
  else if (program_state.stopprint == 0) {
    if ((u.uz.dnum == '\0') && (u.uz.dlevel < '\x01')) {
      if (u.uz.dlevel < '\0') {
        local_248 = "passed away";
      }
      else {
        local_248 = ends[how];
      }
      sprintf(pbuf,"You %s beyond the confines of the dungeon",local_248);
    }
    else {
      _item__5 = (nh_menuitem *)(dungeons + u.uz.dnum);
      bVar8 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      if (bVar8 != '\0') {
        _item__5 = (nh_menuitem *)anon_var_dwarf_3511c;
      }
      sprintf(pbuf,"You %s in %s",ends[how],_item__5);
      if ((u.uz.dnum != dungeon_topology.d_astral_level.dnum) &&
         (bVar8 = on_level(&u.uz,&dungeon_topology.d_knox_level), bVar8 == '\0')) {
        pcVar11 = eos(pbuf);
        bVar8 = In_quest(&u.uz);
        if (bVar8 == '\0') {
          cVar9 = depth(&u.uz);
        }
        else {
          cVar9 = dunlev(&u.uz);
        }
        local_254 = (uint)cVar9;
        sprintf(pcVar11," on dungeon level %d",(ulong)local_254);
      }
    }
    pcVar11 = eos(pbuf);
    pcVar13 = "s";
    if (u.urscore == 1) {
      pcVar13 = "";
    }
    sprintf(pcVar11," with %d point%s,",(ulong)(uint)u.urscore,pcVar13);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
    }
    pnVar12 = _auStack_140 + menu.items._4_4_;
    pnVar12->id = 0;
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,pbuf);
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  if (program_state.stopprint == 0) {
    pcVar11 = "s";
    if (outrip_buf._248_8_ == 1) {
      pcVar11 = "";
    }
    pcVar13 = "s";
    if (moves == 1) {
      pcVar13 = "";
    }
    sprintf(pbuf,"and %ld piece%s of gold, after %u move%s.",outrip_buf._248_8_,pcVar11,(ulong)moves
            ,pcVar13);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
    }
    pnVar12 = _auStack_140 + menu.items._4_4_;
    pnVar12->id = 0;
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,pbuf);
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  if (program_state.stopprint == 0) {
    pcVar11 = "s";
    if (u.uhpmax == 1) {
      pcVar11 = "";
    }
    sprintf(pbuf,"You were level %d with a maximum of %d hit point%s when you %s.",
            (ulong)(uint)u.ulevel,(ulong)(uint)u.uhpmax,pcVar11,ends[how]);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
    }
    pnVar12 = _auStack_140 + menu.items._4_4_;
    pnVar12->id = 0;
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,pbuf);
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
    }
    pnVar12 = _auStack_140 + menu.items._4_4_;
    pnVar12->id = 0;
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,"");
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  uVar7 = outrip_buf._248_8_;
  iVar2 = menu.items._4_4_;
  pnVar12 = _auStack_140;
  p_Var6 = windowprocs.win_outrip;
  if (program_state.stopprint == 0) {
    local_255 = how < 0xc;
    iVar10 = getyear();
    (*p_Var6)(pnVar12,iVar2,local_255,plname,(int)uVar7,local_128,how,iVar10);
  }
  free(_auStack_140);
  program_state.stopprint = iVar4;
  return;
}

Assistant:

void display_rip(int how, char *kilbuf, char *pbuf, long umoney)
{
	char outrip_buf[BUFSZ];
	boolean show_endwin = FALSE;
	struct menulist menu;
	int saved_stopprint = done_stopprint;

	/* always show this under normal circumstances */
	done_stopprint = 0;

	init_menulist(&menu);

	/* clean up unneeded windows */
	if (program_state.game_running) {
	    win_pause_output(P_MESSAGE);

	    if (!done_stopprint || flags.tombstone)
		show_endwin = TRUE;

	    if ((how <= GENOCIDED || how == DISINTEGRATED) &&
		flags.tombstone && show_endwin) {
		/* Put together death description */
		switch (killer_format) {
		    default: warning("bad killer format?");
		    case KILLED_BY_AN:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, an(killer));
			break;
		    case KILLED_BY:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, killer);
			break;
		    case NO_KILLER_PREFIX:
			strcpy(outrip_buf, killer);
			break;
		}
	    }
	} else {
	    done_stopprint = 1;
	}

/* changing kilbuf really changes killer. we do it this way because
   killer is declared a (const char *)
*/
	if (u.uhave.amulet) strcat(kilbuf, " (with the Amulet)");
	else if (how == ESCAPED) {
	    if (Is_astralevel(&u.uz))	/* offered Amulet to wrong deity */
		strcat(kilbuf, " (in celestial disgrace)");
	    else if (carrying(FAKE_AMULET_OF_YENDOR))
		strcat(kilbuf, " (with a fake Amulet)");
		/* don't bother counting to see whether it should be plural */
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "%s %s the %s...", Goodbye(), plname,
		   how != ASCENDED ?
		      (const char *) ((flags.female && urole.name.f) ?
		         urole.name.f : urole.name.m) :
		      (const char *) (flags.female ? "Demigoddess" : "Demigod"));
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}

	if (how == ESCAPED || how == DEFIED || how == ASCENDED) {
	    struct monst *mtmp;
	    struct obj *otmp;
	    const struct val_list *val;
	    int i;

	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++) {
		    val->list[i].count = 0L;
		}
	    get_valuables(invent);

	    /* add points for collected valuables */
	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++)
		    if (val->list[i].count != 0L)
			u.urscore += val->list[i].count
				  * (long)objects[val->list[i].typ].oc_cost;

	    /* count the points for artifacts */
	    artifact_score(invent, TRUE, &menu);

	    keepdogs(1, NULL);	/* only pets follow you */
	    viz_array[0][0] |= IN_SIGHT; /* need visibility for naming */
	    mtmp = mydogs;
	    if (!done_stopprint) strcpy(pbuf, "You");
	    if (mtmp) {
		while (mtmp) {
		    if (!done_stopprint)
			sprintf(eos(pbuf), " and %s", mon_nam(mtmp));
		    if (mtmp->mtame)
			u.urscore += mtmp->mhp;
		    mtmp = mtmp->nmon;
		}
		if (!done_stopprint) add_menutext(&menu, pbuf);
		pbuf[0] = '\0';
	    } else {
		if (!done_stopprint) strcat(pbuf, " ");
	    }
	    if (!done_stopprint) {
		sprintf(eos(pbuf), "%s with %d point%s,",
			how==ASCENDED ? "went to your reward" :
			how==DEFIED   ? "defied the gods and escaped" :
					"escaped from the dungeon",
			u.urscore, plur(u.urscore));
		add_menutext(&menu, pbuf);
	    }

	    if (!done_stopprint)
		artifact_score(invent, FALSE, &menu);	/* list artifacts */

	    /* list valuables here */
	    for (val = valuables; val->list; val++) {
		sort_valuables(val->list, val->size);
		for (i = 0; i < val->size && !done_stopprint; i++) {
		    int typ = val->list[i].typ;
		    long count = val->list[i].count;

		    if (count == 0L) continue;
		    if (objects[typ].oc_class != GEM_CLASS || typ <= LAST_GEM) {
			otmp = mksobj(level, typ, FALSE, FALSE);
			makeknown(otmp->otyp);
			otmp->known = 1;	/* for fake amulets */
			otmp->dknown = 1;	/* seen it (blindness fix) */
			otmp->onamelth = 0;
			otmp->quan = count;
			sprintf(pbuf, "%8ld %s (worth %ld %s),",
				count, xname(otmp),
				count * (long)objects[typ].oc_cost, currency(2L));
			obfree(otmp, NULL);
		    } else {
			sprintf(pbuf,
				"%8ld worthless piece%s of colored glass,",
				count, plur(count));
		    }
		    add_menutext(&menu, pbuf);
		}
	    }

	} else if (!done_stopprint) {
	    /* did not escape or ascend */
	    if (u.uz.dnum == 0 && u.uz.dlevel <= 0) {
		/* level teleported out of the dungeon; `how' is DIED,
		   due to falling or to "arriving at heaven prematurely" */
		sprintf(pbuf, "You %s beyond the confines of the dungeon",
			(u.uz.dlevel < 0) ? "passed away" : ends[how]);
	    } else {
		/* more conventional demise */
		const char *where = dungeons[u.uz.dnum].dname;

		if (Is_astralevel(&u.uz)) where = "The Astral Plane";
		sprintf(pbuf, "You %s in %s", ends[how], where);
		if (!In_endgame(&u.uz) && !Is_knox(&u.uz))
		    sprintf(eos(pbuf), " on dungeon level %d",
			    In_quest(&u.uz) ? dunlev(&u.uz) : depth(&u.uz));
	    }

	    sprintf(eos(pbuf), " with %d point%s,",
		    u.urscore, plur(u.urscore));
	    add_menutext(&menu, pbuf);
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "and %ld piece%s of gold, after %u move%s.",
		    umoney, plur(umoney), moves, plur(moves));
	    add_menutext(&menu, pbuf);
	}
	if (!done_stopprint) {
	    sprintf(pbuf,
	     "You were level %d with a maximum of %d hit point%s when you %s.",
		    u.ulevel, u.uhpmax, plur(u.uhpmax), ends[how]);
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}
	if (!done_stopprint)
	    outrip(menu.items, menu.icount,
		   (how <= GENOCIDED || how == DISINTEGRATED), plname, umoney,
		   outrip_buf, how, getyear());

	free(menu.items);

	done_stopprint = saved_stopprint;
}